

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O2

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs,uint8_t **out)

{
  nghttp2_bufs *pnVar1;
  uint8_t *puVar2;
  uint8_t *dest;
  uint8_t *size;
  
  size = (uint8_t *)0x0;
  pnVar1 = bufs;
  while (pnVar1 = (nghttp2_bufs *)pnVar1->head, pnVar1 != (nghttp2_bufs *)0x0) {
    size = (uint8_t *)pnVar1->max_chunk + ((long)size - (long)pnVar1->chunk_length);
  }
  if (size == (uint8_t *)0x0) {
    size = (uint8_t *)0x0;
  }
  else {
    puVar2 = (uint8_t *)nghttp2_mem_malloc(bufs->mem,(size_t)size);
    dest = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      size = (uint8_t *)0xfffffffffffffc7b;
    }
    else {
      while (bufs = (nghttp2_bufs *)bufs->head, bufs != (nghttp2_bufs *)0x0) {
        dest = nghttp2_cpymem(dest,(uint8_t *)bufs->chunk_length,
                              (long)bufs->max_chunk - (long)bufs->chunk_length);
      }
      *out = puVar2;
    }
  }
  return (ssize_t)size;
}

Assistant:

ssize_t nghttp2_bufs_remove(nghttp2_bufs *bufs, uint8_t **out) {
  size_t len;
  nghttp2_buf_chain *chain;
  nghttp2_buf *buf;
  uint8_t *res;
  nghttp2_buf resbuf;

  len = 0;

  for (chain = bufs->head; chain; chain = chain->next) {
    len += nghttp2_buf_len(&chain->buf);
  }

  if (len == 0) {
    res = NULL;
    return 0;
  }

  res = nghttp2_mem_malloc(bufs->mem, len);
  if (res == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_buf_wrap_init(&resbuf, res, len);

  for (chain = bufs->head; chain; chain = chain->next) {
    buf = &chain->buf;
    resbuf.last = nghttp2_cpymem(resbuf.last, buf->pos, nghttp2_buf_len(buf));
  }

  *out = res;

  return (ssize_t)len;
}